

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

int yaml_check_utf8(yaml_char_t *start,size_t length)

{
  byte bVar1;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  ulong local_48;
  size_t k;
  uint value;
  uint width;
  uchar octet;
  yaml_char_t *pointer;
  yaml_char_t *end;
  size_t length_local;
  yaml_char_t *start_local;
  
  _width = start;
  while( true ) {
    if (start + length <= _width) {
      return 1;
    }
    bVar1 = *_width;
    if ((bVar1 & 0x80) == 0) {
      local_4c = 1;
    }
    else {
      if ((bVar1 & 0xe0) == 0xc0) {
        local_50 = 2;
      }
      else {
        if ((bVar1 & 0xf0) == 0xe0) {
          local_54 = 3;
        }
        else {
          local_54 = 0;
          if ((bVar1 & 0xf8) == 0xf0) {
            local_54 = 4;
          }
        }
        local_50 = local_54;
      }
      local_4c = local_50;
    }
    if ((bVar1 & 0x80) == 0) {
      local_58 = bVar1 & 0x7f;
    }
    else {
      if ((bVar1 & 0xe0) == 0xc0) {
        local_5c = bVar1 & 0x1f;
      }
      else {
        if ((bVar1 & 0xf0) == 0xe0) {
          local_60 = bVar1 & 0xf;
        }
        else {
          if ((bVar1 & 0xf8) == 0xf0) {
            local_64 = bVar1 & 7;
          }
          else {
            local_64 = 0;
          }
          local_60 = local_64;
        }
        local_5c = local_60;
      }
      local_58 = local_5c;
    }
    k._4_4_ = local_58;
    if (local_4c == 0) {
      return 0;
    }
    if (start + length < _width + local_4c) {
      return 0;
    }
    for (local_48 = 1; local_48 < local_4c; local_48 = local_48 + 1) {
      if ((_width[local_48] & 0xc0) != 0x80) {
        return 0;
      }
      k._4_4_ = k._4_4_ * 0x40 + (_width[local_48] & 0x3f);
    }
    if ((((local_4c != 1) && ((local_4c != 2 || (k._4_4_ < 0x80)))) &&
        ((local_4c != 3 || (k._4_4_ < 0x800)))) && ((local_4c != 4 || (k._4_4_ < 0x10000)))) break;
    _width = _width + local_4c;
  }
  return 0;
}

Assistant:

static int
yaml_check_utf8(yaml_char_t *start, size_t length)
{
    yaml_char_t *end = start+length;
    yaml_char_t *pointer = start;

    while (pointer < end) {
        unsigned char octet;
        unsigned int width;
        unsigned int value;
        size_t k;

        octet = pointer[0];
        width = (octet & 0x80) == 0x00 ? 1 :
                (octet & 0xE0) == 0xC0 ? 2 :
                (octet & 0xF0) == 0xE0 ? 3 :
                (octet & 0xF8) == 0xF0 ? 4 : 0;
        value = (octet & 0x80) == 0x00 ? octet & 0x7F :
                (octet & 0xE0) == 0xC0 ? octet & 0x1F :
                (octet & 0xF0) == 0xE0 ? octet & 0x0F :
                (octet & 0xF8) == 0xF0 ? octet & 0x07 : 0;
        if (!width) return 0;
        if (pointer+width > end) return 0;
        for (k = 1; k < width; k ++) {
            octet = pointer[k];
            if ((octet & 0xC0) != 0x80) return 0;
            value = (value << 6) + (octet & 0x3F);
        }
        if (!((width == 1) ||
            (width == 2 && value >= 0x80) ||
            (width == 3 && value >= 0x800) ||
            (width == 4 && value >= 0x10000))) return 0;

        pointer += width;
    }

    return 1;
}